

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O3

int CfdFreeCombinePubkeyHandle(void *handle,void *combine_handle)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  CfdCapiCombinePubkey *combine_struct;
  string local_40;
  
  cfd::Initialize();
  if ((combine_handle != (void *)0x0) &&
     (this = *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               **)((long)combine_handle + 0x10),
     this != (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this);
    operator_delete(this);
    *(undefined8 *)((long)combine_handle + 0x10) = 0;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CombinePubkey","");
  cfd::capi::FreeBuffer(combine_handle,&local_40,0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int CfdFreeCombinePubkeyHandle(void* handle, void* combine_handle) {
  try {
    cfd::Initialize();
    if (combine_handle != nullptr) {
      CfdCapiCombinePubkey* combine_struct =
          static_cast<CfdCapiCombinePubkey*>(combine_handle);
      if (combine_struct->pubkey_list != nullptr) {
        delete combine_struct->pubkey_list;
        combine_struct->pubkey_list = nullptr;
      }
    }
    FreeBuffer(
        combine_handle, kPrefixCombinePubkey, sizeof(CfdCapiCombinePubkey));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return CfdErrorCode::kCfdUnknownError;
}